

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O3

word_type __thiscall
bv::internal::bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
get(bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this,
   size_t begin,size_t end)

{
  _Elt_pointer puVar1;
  _Map_pointer ppuVar2;
  sbyte sVar3;
  long lVar4;
  ulong *puVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  _Elt_pointer puVar9;
  ulong uVar10;
  ulong uVar11;
  
  puVar1 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar10 = begin >> 6;
  ppuVar2 = (this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node;
  uVar11 = end - (end != 0) >> 6;
  lVar4 = (long)puVar1 -
          (long)(this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_start._M_first >> 3;
  uVar8 = lVar4 + uVar11;
  if ((long)uVar8 < 0) {
    uVar7 = (long)uVar8 >> 6;
LAB_0010ebec:
    puVar9 = ppuVar2[uVar7] + uVar8 + uVar7 * -0x40;
  }
  else {
    if (0x3f < uVar8) {
      uVar7 = uVar8 >> 6;
      goto LAB_0010ebec;
    }
    puVar9 = puVar1 + uVar11;
  }
  bVar6 = 0x40 - (-(char)end & 0x3fU);
  sVar3 = (bVar6 < 0x41) * ('@' - bVar6);
  uVar8 = (*puVar9 << sVar3) >> sVar3;
  if (uVar11 <= uVar10) {
    if (end <= begin) {
      return 0;
    }
    return uVar8 >> (begin & 0x3f);
  }
  uVar11 = lVar4 + uVar10;
  if ((long)uVar11 < 0) {
    uVar10 = (long)uVar11 >> 6;
  }
  else {
    if (uVar11 < 0x40) {
      puVar5 = puVar1 + uVar10;
      goto LAB_0010ec53;
    }
    uVar10 = uVar11 >> 6;
  }
  puVar5 = ppuVar2[uVar10] + uVar11 + uVar10 * -0x40;
LAB_0010ec53:
  bVar6 = (byte)begin & 0x3f;
  return *puVar5 >> bVar6 | uVar8 << 0x40 - bVar6;
}

Assistant:

bitview_base::word_type
        bitview<C>::get(size_t begin, size_t end) const
        {
            static constexpr size_t bits = bitsize<word_type>();
            static constexpr size_t mask = ~ size_t(0) / bits * bits;
            
            // everything above has been computed at compile time.
            // Now do some work:
            
            // the index in the container of
            // the lower or higher item needed
            size_t lo_index = (begin          ) / bits;
            size_t hi_index = (end - (end > 0)) / bits;
            
            // we read container[hi_adr] first and possibly delete
            // the highest bits:
            size_t hi_shift = size_t(mask - end) % bits;
            word_type hi_val = _container[hi_index] << hi_shift >> hi_shift;
            
            // if all bits are in the same item,
            // we delete the lower bits and are done:
            size_t lo_shift = begin % bits;
            if ( hi_index <= lo_index )
                return (hi_val >> lo_shift) * (begin < end);
            
            // else we have to read the lower item as well, and combine both
            return ( hi_val << (bits - lo_shift)    |
                     _container[lo_index] >> lo_shift );
            
        }